

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O2

int lws_rxflow_cache(lws *wsi,uchar *buf,int n,int len)

{
  lws_buflist **head;
  char cVar1;
  lws_context *plVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t len_00;
  uint8_t *buffered;
  
  plVar2 = wsi->context;
  cVar1 = wsi->tsi;
  head = &wsi->buflist;
  sVar5 = lws_buflist_next_segment_len(head,&buffered);
  if (sVar5 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 1;
    if ((buffered <= buf) &&
       (len_00 = sVar5 - (long)len, len_00 != 0 && buf + len <= buffered + sVar5)) {
      lws_buflist_use_segment(head,len_00);
      _lws_log(0x10,"%s: trim existing rxflow %d -> %d\n","lws_rxflow_cache",sVar5 & 0xffffffff,
               (ulong)(uint)len);
      return 2;
    }
  }
  _lws_log(0x10,"%s: rxflow append %d\n","lws_rxflow_cache",(ulong)(uint)(len - n));
  iVar3 = lws_buflist_append_segment(head,buf + n,(long)(len - n));
  if (iVar3 < 0) {
    iVar4 = -1;
  }
  else if ((iVar3 != 0) &&
          (_lws_log(0x10,"%s: added %p to rxflow list\n","lws_rxflow_cache",wsi),
          (wsi->dll_buflist).owner == (lws_dll2_owner *)0x0)) {
    lws_dll2_add_head(&wsi->dll_buflist,&plVar2->pt[cVar1].dll_buflist_owner);
  }
  return iVar4;
}

Assistant:

int
lws_rxflow_cache(struct lws *wsi, unsigned char *buf, int n, int len)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *buffered;
	size_t blen;
	int ret = LWSRXFC_CACHED, m;

	/* his RX is flowcontrolled, don't send remaining now */
	blen = lws_buflist_next_segment_len(&wsi->buflist, &buffered);
	if (blen) {
		if (buf >= buffered && buf + len <= buffered + blen &&
		    blen != (size_t)len) {
			/*
			 * rxflow while we were spilling prev rxflow
			 *
			 * len indicates how much was unused, then... so trim
			 * the head buflist to match that situation
			 */

			lws_buflist_use_segment(&wsi->buflist, blen - len);
			lwsl_debug("%s: trim existing rxflow %d -> %d\n",
					__func__, (int)blen, (int)len);

			return LWSRXFC_TRIMMED;
		}
		ret = LWSRXFC_ADDITIONAL;
	}

	/* a new rxflow, buffer it and warn caller */

	lwsl_debug("%s: rxflow append %d\n", __func__, len - n);
	m = lws_buflist_append_segment(&wsi->buflist, buf + n, len - n);

	if (m < 0)
		return LWSRXFC_ERROR;
	if (m) {
		lwsl_debug("%s: added %p to rxflow list\n", __func__, wsi);
		if (lws_dll2_is_detached(&wsi->dll_buflist))
			lws_dll2_add_head(&wsi->dll_buflist, &pt->dll_buflist_owner);
	}

	return ret;
}